

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

double mp::
       ComputeValue<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>,mp::VarInfoRecomp>
                 (ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *param_1,
                 VarInfoRecomp *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  CStringRef in_RSI;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar1;
  BasicCStringRef<char> local_40 [2];
  char **in_stack_ffffffffffffffd0;
  CStringRef in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  Error *in_stack_ffffffffffffffe8;
  
  uVar1 = 1;
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_40,"ComputeValue({}) not implemented.");
  std::type_info::name
            ((type_info *)
             &ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>::typeinfo);
  fmt::format<char_const*>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),s);
  Error::Error(in_stack_ffffffffffffffe8,in_RSI,in_stack_ffffffffffffffe4);
  __cxa_throw(s,&Error::typeinfo,Error::~Error);
}

Assistant:

double ComputeValue(const Con& , const VarVec& ) {
  MP_RAISE(fmt::format("ComputeValue({}) not implemented.",
                       typeid(Con).name()));
  return 0.0;
}